

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

void __thiscall Sudoku::skryjNa30(Sudoku *this)

{
  uint *puVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  int n;
  int iVar7;
  uint auStack_860 [413];
  Sudoku local_1ec;
  
  do {
    memset(&local_1ec,0,0x1bc);
    for (iVar7 = 0; iVar7 != 0x1e; iVar7 = iVar7 + 1) {
      do {
        iVar4 = rand();
        iVar4 = iVar4 % 0x51;
        bVar2 = *(byte *)(local_1ec.s.pole + iVar4);
      } while ((bVar2 & 0xf) != 0);
      bVar5 = *(byte *)((this->s).pole + iVar4) & 0xf;
      *(byte *)(local_1ec.s.pole + iVar4) = bVar2 | bVar5 | 0x10;
      cVar3 = (char)iVar4;
      uVar6 = 1 << bVar5;
      puVar1 = local_1ec.s.radky + cVar3 / '\t';
      *puVar1 = *puVar1 | uVar6;
      puVar1 = local_1ec.s.sloupce + (int)(cVar3 % '\t');
      *puVar1 = *puVar1 | uVar6;
      puVar1 = local_1ec.s.ctverce[(char)((cVar3 % '\t') / '\x03')] + cVar3 / '\x1b';
      *puVar1 = *puVar1 | uVar6;
    }
    local_1ec.s.doplnenych = 0x1e;
    iVar7 = jednoducheReseni(&local_1ec);
  } while (iVar7 == 0);
  memcpy(this,&local_1ec,0x1bc);
  return;
}

Assistant:

void Sudoku::skryjNa30()
{
  Sudoku temp(-1); // vytvorime prazdne sudoku
  int x,y;
  do
  {
    temp.initPole(); // uplne vyprazdnime docasne sudoku
    // hledame 30 poli
    for (int n=0; n<30; n++)
    {
      int i;
      do
      {
        i = rand() % 81;
      } while (temp.s.pole[i].zapsane); // najdeme v docasnem sudoku nahodne prazdne policko
      // preneseme z naseho sudoku cislo do docasneho
      temp.s.pole[i].zapsane = s.pole[i].zapsane;
      temp.s.pole[i].pevne = true;// generujeme, vse pevne
      x = i % 9;
      y = i / 9;
      // zakazeme pouzit v radcich/sloupcich/ctvercich vyplnene pole
      temp.s.radky[y] |= (1 << s.pole[i].zapsane);
      temp.s.sloupce[x] |= (1 << s.pole[i].zapsane);
      temp.s.ctverce[x/3][y/3] |= (1 << s.pole[i].zapsane);
    }
    temp.s.doplnenych = 30; // vyplnili jsme 30 policek
  } while (!temp.jednoducheReseni()); // dokud se neda sudoku vyresit jednoduchym doplnovanim
  s = temp.s;// preneseni stavu z docasneho sudoku
}